

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::number::impl::CurrencySymbols::getPluralName
          (UnicodeString *__return_storage_ptr__,CurrencySymbols *this,Form plural,
          UErrorCode *status)

{
  char *locale;
  char *pluralCount;
  undefined1 *currency;
  UBool isChoiceFormat;
  int32_t symbolLen;
  ConstChar16Ptr local_48 [3];
  
  symbolLen = 0;
  isChoiceFormat = '\0';
  locale = (this->fLocaleName).buffer.ptr;
  currency = &(this->fCurrency).super_MeasureUnit.field_0x14;
  pluralCount = StandardPlural::getKeyword(plural);
  local_48[0].p_ =
       ucurr_getPluralName_63
                 ((UChar *)currency,locale,&isChoiceFormat,pluralCount,&symbolLen,status);
  if (local_48[0].p_ == (char16_t *)currency) {
    UnicodeString::UnicodeString(__return_storage_ptr__,(UChar *)currency,3);
  }
  else {
    UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_48,symbolLen);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString CurrencySymbols::getPluralName(StandardPlural::Form plural, UErrorCode& status) const {
    const char16_t* isoCode = fCurrency.getISOCurrency();
    UBool isChoiceFormat = FALSE;
    int32_t symbolLen = 0;
    const char16_t* symbol = ucurr_getPluralName(
            isoCode,
            fLocaleName.data(),
            &isChoiceFormat,
            StandardPlural::getKeyword(plural),
            &symbolLen,
            &status);
    // If given an unknown currency, ucurr_getName returns the input string, which we can't alias safely!
    // Otherwise, symbol points to a resource bundle, and we can use readonly-aliasing constructor.
    if (symbol == isoCode) {
        return UnicodeString(isoCode, 3);
    } else {
        return UnicodeString(TRUE, symbol, symbolLen);
    }
}